

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ref.c
# Opt level: O2

int run_test_udp_ref2(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  undefined8 uVar3;
  char *pcVar4;
  sockaddr_in addr;
  uv_udp_t h;
  sockaddr_in local_f0;
  uv_udp_t local_e0;
  
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&local_f0);
  if (iVar1 == 0) {
    puVar2 = uv_default_loop();
    uv_udp_init(puVar2,&local_e0);
    uv_udp_bind(&local_e0,(sockaddr *)&local_f0,0);
    uv_udp_recv_start(&local_e0,fail_cb,fail_cb);
    uv_unref((uv_handle_t *)&local_e0);
    puVar2 = uv_default_loop();
    uv_run(puVar2,UV_RUN_DEFAULT);
    do_close(&local_e0);
    puVar2 = uv_default_loop();
    close_loop(puVar2);
    puVar2 = uv_default_loop();
    iVar1 = uv_loop_close(puVar2);
    if (iVar1 == 0) {
      return 0;
    }
    pcVar4 = "0 == uv_loop_close(uv_default_loop())";
    uVar3 = 0x13f;
  }
  else {
    pcVar4 = "0 == uv_ip4_addr(\"127.0.0.1\", TEST_PORT, &addr)";
    uVar3 = 0x138;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ref.c"
          ,uVar3,pcVar4);
  abort();
}

Assistant:

TEST_IMPL(udp_ref2) {
  struct sockaddr_in addr;
  uv_udp_t h;
  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));
  uv_udp_init(uv_default_loop(), &h);
  uv_udp_bind(&h, (const struct sockaddr*) &addr, 0);
  uv_udp_recv_start(&h, (uv_alloc_cb)fail_cb, (uv_udp_recv_cb)fail_cb);
  uv_unref((uv_handle_t*)&h);
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  do_close(&h);
  MAKE_VALGRIND_HAPPY();
  return 0;
}